

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O1

int luabridge::detail::Invoke<unsigned_int,luabridge::detail::TypeList<unsigned_int,void>,1>::
    run<unsigned_int(*)(unsigned_int)>(lua_State *L,_func_uint_uint **fn)

{
  uint uVar1;
  lua_Integer lVar2;
  
  lVar2 = luaL_checkinteger(L,1);
  uVar1 = (**fn)((uint)lVar2);
  lua_pushinteger(L,(ulong)uVar1);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }